

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

int quicly_ranges_subtract(quicly_ranges_t *ranges,uint64_t start,uint64_t end)

{
  int iVar1;
  ulong in_RDX;
  ulong in_RSI;
  quicly_ranges_t *in_RDI;
  int ret;
  size_t unaff_retaddr;
  size_t slot;
  size_t shrink_from;
  size_t local_30;
  size_t local_28;
  
  if (in_RDX < in_RSI) {
    __assert_fail("start <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/ranges.c"
                  ,0x8d,"int quicly_ranges_subtract(quicly_ranges_t *, uint64_t, uint64_t)");
  }
  if ((((in_RSI != in_RDX) && (in_RDI->num_ranges != 0)) && (in_RDI->ranges->start < in_RDX)) &&
     (in_RSI < in_RDI->ranges[in_RDI->num_ranges - 1].end)) {
    for (local_30 = 0; in_RDI->ranges[local_30].end < in_RSI; local_30 = local_30 + 1) {
    }
    if (in_RDI->ranges[local_30].end < in_RDX) {
      if (in_RDI->ranges[local_30].start < in_RSI) {
        in_RDI->ranges[local_30].end = in_RSI;
        local_28 = local_30 + 1;
      }
      else {
        local_28 = local_30;
      }
      do {
        local_30 = local_30 + 1;
        if ((local_30 == in_RDI->num_ranges) || (in_RDX <= in_RDI->ranges[local_30].start))
        goto LAB_0014b1d8;
      } while (in_RDI->ranges[local_30].end <= in_RDX);
      in_RDI->ranges[local_30].start = in_RDX;
LAB_0014b1d8:
      if (local_28 != local_30) {
        quicly_ranges_drop_by_range_indices(in_RDI,in_RSI,in_RDX);
      }
    }
    else if (in_RDI->ranges[local_30].start < in_RDX) {
      if (in_RDI->ranges[local_30].start < in_RSI) {
        if (in_RDX != in_RDI->ranges[local_30].end) {
          iVar1 = insert_at((quicly_ranges_t *)end,shrink_from,slot,unaff_retaddr);
          if (iVar1 == 0) {
            in_RDI->ranges[local_30].end = in_RSI;
            return 0;
          }
          return iVar1;
        }
        in_RDI->ranges[local_30].end = in_RSI;
      }
      else {
        in_RDI->ranges[local_30].start = in_RDX;
      }
      if (in_RDI->ranges[local_30].start == in_RDI->ranges[local_30].end) {
        quicly_ranges_drop_by_range_indices(in_RDI,in_RSI,in_RDX);
      }
    }
  }
  return 0;
}

Assistant:

int quicly_ranges_subtract(quicly_ranges_t *ranges, uint64_t start, uint64_t end)
{
    size_t shrink_from, slot;

    assert(start <= end);

    if (start == end)
        return 0;

    if (ranges->num_ranges == 0) {
        return 0;
    } else if (end <= ranges->ranges[0].start) {
        return 0;
    } else if (ranges->ranges[ranges->num_ranges - 1].end <= start) {
        return 0;
    }

    /* find the first overlapping slot */
    for (slot = 0; ranges->ranges[slot].end < start; ++slot)
        ;

    if (end <= ranges->ranges[slot].end) {
        /* first overlapping slot is the only slot that we will ever modify */
        if (end <= ranges->ranges[slot].start)
            return 0;
        if (start <= ranges->ranges[slot].start) {
            ranges->ranges[slot].start = end;
        } else if (end == ranges->ranges[slot].end) {
            ranges->ranges[slot].end = start;
        } else {
            /* split */
            int ret;
            if ((ret = insert_at(ranges, end, ranges->ranges[slot].end, slot + 1)) != 0)
                return ret;
            ranges->ranges[slot].end = start;
            return 0;
        }
        /* remove the slot if the range has become empty */
        if (ranges->ranges[slot].start == ranges->ranges[slot].end)
            quicly_ranges_drop_by_range_indices(ranges, slot, slot + 1);
        return 0;
    }

    /* specified region covers multiple slots */
    if (start <= ranges->ranges[slot].start) {
        shrink_from = slot;
    } else {
        ranges->ranges[slot].end = start;
        shrink_from = slot + 1;
    }

    /* find the last overlapping slot */
    for (++slot; slot != ranges->num_ranges; ++slot) {
        if (end <= ranges->ranges[slot].start)
            break;
        if (end < ranges->ranges[slot].end) {
            ranges->ranges[slot].start = end;
            break;
        }
    }

    /* remove shrink_from..slot */
    if (shrink_from != slot)
        quicly_ranges_drop_by_range_indices(ranges, shrink_from, slot);

    return 0;
}